

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O3

int PSolve(sunrealtype t,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  sunrealtype sVar14;
  undefined1 auVar15 [16];
  
  N_VScale(0x3ff0000000000000,r,z);
  GSIter(gamma,z,*(N_Vector *)((long)user_data + 0x9930),(WebData)user_data);
  iVar2 = *(int *)((long)user_data + 0x54);
  if (0 < (long)iVar2) {
    iVar3 = *(int *)((long)user_data + 0x5c);
    uVar4 = *(uint *)((long)user_data + 0x50);
    iVar5 = *(int *)((long)user_data + 0x48);
    lVar10 = 0;
    iVar12 = 0;
    do {
      if (0 < (int)uVar4) {
        iVar6 = *(int *)((long)user_data + lVar10 * 4 + 0xd0);
        lVar13 = (long)iVar12 * 8;
        iVar12 = iVar12 + iVar5 * uVar4;
        uVar11 = 0;
        do {
          lVar9 = (long)*(int *)((long)user_data + uVar11 * 4 + 0x80) + (long)iVar6 * (long)iVar3;
          uVar7 = *(undefined8 *)((long)user_data + lVar9 * 8);
          uVar8 = *(undefined8 *)((long)user_data + lVar9 * 8 + 0x20);
          lVar9 = N_VGetArrayPointer(z);
          SUNDlsMat_denseGETRS(uVar7,(long)iVar5,uVar8,lVar9 + lVar13);
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + (long)iVar5 * 8;
        } while (uVar4 != uVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  auVar15 = N_VGetArrayPointer(r);
  dVar1 = *(double *)(auVar15._0_8_ + 0x4b00);
  sVar14 = doubleIntgr(z,(int)user_data,auVar15._8_8_);
  lVar10 = N_VGetArrayPointer(z);
  *(double *)(lVar10 + 0x4b00) = gamma * sVar14 + dVar1;
  return 0;
}

Assistant:

static int PSolve(sunrealtype t, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->vtemp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  /* Solve for the quadrature variable */
  N_VGetArrayPointer(z)[NEQ] = N_VGetArrayPointer(r)[NEQ] +
                               gamma * doubleIntgr(z, ISPEC, wdata);

  return (0);
}